

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

Char * Diligent::GetFenceTypeString(FENCE_TYPE Type)

{
  char *pcVar1;
  int iVar2;
  undefined7 in_register_00000039;
  string msg;
  string local_28;
  
  iVar2 = (int)CONCAT71(in_register_00000039,Type);
  if (iVar2 == 0) {
    pcVar1 = "CPU_WAIT_ONLY";
  }
  else if (iVar2 == 1) {
    pcVar1 = "GENERAL";
  }
  else {
    FormatString<char[22]>(&local_28,(char (*) [22])"Unexpected fence type");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetFenceTypeString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x9de);
    std::__cxx11::string::~string((string *)&local_28);
    pcVar1 = "Unknown";
  }
  return pcVar1;
}

Assistant:

const Char* GetFenceTypeString(FENCE_TYPE Type)
{
    static_assert(FENCE_TYPE_LAST == 1, "Please update the switch below to handle the new fence type");
    switch (Type)
    {
        // clang-format off
        case FENCE_TYPE_CPU_WAIT_ONLY: return "CPU_WAIT_ONLY";
        case FENCE_TYPE_GENERAL:       return "GENERAL";
        // clang-format on
        default:
            UNEXPECTED("Unexpected fence type");
            return "Unknown";
    }
}